

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f * __thiscall Matrix4f::transposed(Matrix4f *__return_storage_ptr__,Matrix4f *this)

{
  int i;
  long lVar1;
  float *pfVar2;
  long lVar3;
  
  Matrix4f(__return_storage_ptr__,0.0);
  lVar1 = 0;
  pfVar2 = __return_storage_ptr__->m_elements;
  for (; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      *(float *)((long)pfVar2 + lVar3) = *(float *)((long)this + lVar3 * 4);
    }
    pfVar2 = pfVar2 + 4;
    this = (Matrix4f *)((long)this + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::transposed() const
{
	Matrix4f out;
	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}